

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

MultiFab * __thiscall NavierStokesBase::get_rho_half_time(NavierStokesBase *this)

{
  bool bVar1;
  FabArray<amrex::FArrayBox> *in_RDI;
  Array4<double> *rho_c;
  Array4<double> *rho_p;
  Array4<double> *rho_h;
  Box *bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffdc0;
  undefined1 local_228 [15];
  undefined1 in_stack_fffffffffffffde7;
  FabArrayBase *in_stack_fffffffffffffde8;
  MFIter *in_stack_fffffffffffffdf0;
  anon_class_192_3_6be84991 *in_stack_fffffffffffffe00;
  Box *in_stack_fffffffffffffe08;
  undefined1 auStack_1e8 [20];
  int in_stack_fffffffffffffe2c;
  MFIter *in_stack_fffffffffffffe30;
  undefined1 auStack_1a8 [64];
  undefined1 local_168 [64];
  undefined1 *local_128;
  undefined1 local_120 [64];
  undefined1 *local_e0;
  undefined1 local_d8 [64];
  undefined1 *local_98;
  undefined1 local_8c [36];
  MFIter local_68;
  
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(bool)in_stack_fffffffffffffde7);
  while( true ) {
    bVar1 = amrex::MFIter::isValid(&local_68);
    if (!bVar1) break;
    amrex::MFIter::growntilebox(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    local_8c._28_8_ = local_8c;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffffdc0);
    local_98 = local_d8;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffffdc0);
    local_e0 = local_120;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffffdc0);
    local_128 = local_168;
    in_stack_fffffffffffffdc0 = (MFIter *)local_8c._28_8_;
    memcpy(local_228,local_98,0x3c);
    memcpy(auStack_1e8,local_e0,0x3c);
    memcpy(auStack_1a8,local_128,0x3c);
    amrex::ParallelFor<NavierStokesBase::get_rho_half_time()::__0>
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    amrex::MFIter::operator++(&local_68);
  }
  amrex::MFIter::~MFIter(in_stack_fffffffffffffdc0);
  return (MultiFab *)((long)&in_RDI[0xc].super_FabArrayBase.boxarray.m_bat.m_op + 0x14);
}

Assistant:

MultiFab&
NavierStokesBase::get_rho_half_time ()
{
    //
    // Fill it in when needed ...
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rho_half,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox();
        auto const& rho_h = rho_half.array(mfi);
        auto const& rho_p = rho_ptime.array(mfi);
        auto const& rho_c = rho_ctime.array(mfi);
        amrex::ParallelFor(bx, [rho_h, rho_p, rho_c]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
           rho_h(i,j,k) = 0.5 * (rho_p(i,j,k) + rho_c(i,j,k));
        });
    }
    return rho_half;
}